

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGComputeInterleaves(void *payload,void *data,xmlChar *name)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  void *pvVar7;
  undefined8 *puVar8;
  xmlRelaxNGDefinePtr_conflict *ppxVar9;
  int *piVar10;
  xmlHashTablePtr pxVar11;
  undefined1 *puVar12;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_00;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_01;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_02;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_03;
  xmlChar *key2;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_04;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_05;
  void *pvVar13;
  int iVar14;
  undefined1 *puVar15;
  char *key;
  size_t sVar16;
  xmlRelaxNGDefinePtr_conflict def;
  undefined1 *puVar17;
  ulong uVar18;
  undefined1 *payload_00;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  
  if (*(int *)((long)data + 0x44) == 0) {
    sVar16 = 0;
    for (lVar6 = *(long *)((long)payload + 0x30); lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x40)) {
      sVar16 = sVar16 + 8;
    }
    pvVar7 = (*xmlMalloc)(sVar16);
    if (pvVar7 == (void *)0x0) {
      xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)data);
      return;
    }
    def = *(xmlRelaxNGDefinePtr_conflict *)((long)payload + 0x30);
    if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
      bVar21 = true;
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      iVar14 = 0;
      do {
        puVar8 = (undefined8 *)(*xmlMalloc)(0x18);
        *(undefined8 **)((long)pvVar7 + uVar18 * 8) = puVar8;
        if (puVar8 == (undefined8 *)0x0) goto LAB_00180027;
        iVar14 = iVar14 + (uint)(def->type == XML_RELAXNG_TEXT);
        *puVar8 = def;
        ppxVar9 = xmlRelaxNGGetElements((xmlRelaxNGParserCtxtPtr)data,def,2);
        *(xmlRelaxNGDefinePtr_conflict **)(*(long *)((long)pvVar7 + uVar18 * 8) + 8) = ppxVar9;
        ppxVar9 = xmlRelaxNGGetElements((xmlRelaxNGParserCtxtPtr)data,def,1);
        *(xmlRelaxNGDefinePtr_conflict **)(*(long *)((long)pvVar7 + uVar18 * 8) + 0x10) = ppxVar9;
        uVar18 = uVar18 + 1;
        def = def->next;
      } while (def != (xmlRelaxNGDefinePtr)0x0);
      bVar21 = iVar14 == 0;
    }
    piVar10 = (int *)(*xmlMalloc)(0x20);
    if (piVar10 == (int *)0x0) {
LAB_00180027:
      xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)data);
      if ((int)uVar18 != 0) {
        uVar20 = 0;
        do {
          pvVar13 = *(void **)((long)pvVar7 + uVar20 * 8);
          if (pvVar13 != (void *)0x0) {
            if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
              (*xmlFree)(*(void **)((long)pvVar13 + 8));
              pvVar13 = *(void **)((long)pvVar7 + uVar20 * 8);
            }
            (*xmlFree)(pvVar13);
          }
          uVar20 = uVar20 + 1;
        } while ((uVar18 & 0xffffffff) != uVar20);
      }
      (*xmlFree)(pvVar7);
      return;
    }
    piVar10[0] = 0;
    piVar10[1] = 0;
    piVar10[2] = 0;
    piVar10[3] = 0;
    piVar10[4] = 0;
    piVar10[5] = 0;
    piVar10[6] = 0;
    piVar10[7] = 0;
    iVar14 = (int)uVar18;
    *piVar10 = iVar14;
    pxVar11 = xmlHashCreate(iVar14);
    *(xmlHashTablePtr *)(piVar10 + 2) = pxVar11;
    if (iVar14 == 0) {
      uVar5 = 1;
    }
    else {
      puVar12 = (undefined1 *)(uVar18 & 0xffffffff);
      payload_00 = (undefined1 *)0x0;
      ppxVar9 = extraout_RDX;
      pvVar13 = pvVar7;
      puVar15 = puVar12;
      uVar19 = 1;
      do {
        lVar6 = *(long *)((long)pvVar7 + (long)payload_00 * 8);
        payload_00 = payload_00 + 1;
        if (payload_00 < puVar12) {
          puVar17 = &DAT_00000001;
          do {
            lVar2 = *(long *)((long)pvVar13 + (long)puVar17 * 8);
            if (lVar2 != 0) {
              iVar14 = xmlRelaxNGCompareElemDefLists
                                 (*(xmlRelaxNGParserCtxtPtr *)(lVar6 + 8),
                                  *(xmlRelaxNGDefinePtr_conflict **)(lVar2 + 8),ppxVar9);
              ppxVar9 = extraout_RDX_00;
              if (iVar14 == 0) {
                xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x3fd,
                           "Element or text conflicts in interleave\n",(xmlChar *)0x0,(xmlChar *)0x0
                          );
                ppxVar9 = extraout_RDX_01;
              }
              iVar14 = xmlRelaxNGCompareElemDefLists
                                 (*(xmlRelaxNGParserCtxtPtr *)(lVar6 + 0x10),
                                  *(xmlRelaxNGDefinePtr_conflict **)
                                   (*(long *)((long)pvVar13 + (long)puVar17 * 8) + 0x10),ppxVar9);
              ppxVar9 = extraout_RDX_02;
              if (iVar14 == 0) {
                xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x3e9,
                           "Attributes conflicts in interleave\n",(xmlChar *)0x0,(xmlChar *)0x0);
                ppxVar9 = extraout_RDX_03;
              }
            }
            puVar17 = puVar17 + 1;
          } while (puVar15 != puVar17);
        }
        plVar3 = *(long **)(lVar6 + 8);
        uVar5 = 0;
        if (plVar3 != (long *)0x0) {
          puVar4 = (uint *)*plVar3;
          while (puVar4 != (uint *)0x0) {
            uVar1 = *puVar4;
            ppxVar9 = (xmlRelaxNGDefinePtr_conflict *)(ulong)uVar1;
            if (uVar1 == 4) {
              key = *(char **)(puVar4 + 4);
              key2 = *(xmlChar **)(puVar4 + 6);
              if ((xmlChar *)key == (xmlChar *)0x0) {
                if (key2 == (xmlChar *)0x0) {
                  pxVar11 = *(xmlHashTablePtr *)(piVar10 + 2);
LAB_0017ffd0:
                  key2 = (xmlChar *)0x0;
                }
                else {
                  pxVar11 = *(xmlHashTablePtr *)(piVar10 + 2);
                  if (*key2 == '\0') goto LAB_0017ffd0;
                }
                iVar14 = xmlHashAddEntry2(pxVar11,"#any",key2,payload_00);
                ppxVar9 = extraout_RDX_05;
                if (*(long *)(*plVar3 + 0x50) != 0) {
                  uVar19 = 2;
                }
              }
              else {
                if (key2 == (xmlChar *)0x0) {
                  pxVar11 = *(xmlHashTablePtr *)(piVar10 + 2);
LAB_0017ff67:
                  key2 = (xmlChar *)0x0;
                }
                else {
                  pxVar11 = *(xmlHashTablePtr *)(piVar10 + 2);
                  if (*key2 == '\0') goto LAB_0017ff67;
                }
                iVar14 = xmlHashAddEntry2(pxVar11,(xmlChar *)key,key2,payload_00);
                ppxVar9 = extraout_RDX_04;
              }
              uVar5 = -(uint)(iVar14 != 0) | uVar19;
            }
            else {
              uVar5 = 0xffffffff;
              if (uVar1 == 3) {
                pxVar11 = *(xmlHashTablePtr *)(piVar10 + 2);
                key = "#text";
                goto LAB_0017ff67;
              }
            }
            puVar4 = (uint *)plVar3[1];
            plVar3 = plVar3 + 1;
            uVar19 = uVar5;
          }
        }
        pvVar13 = (void *)((long)pvVar13 + 8);
        puVar15 = puVar15 + -1;
        uVar19 = uVar5;
      } while (payload_00 != puVar12);
    }
    *(void **)(piVar10 + 6) = pvVar7;
    *(int **)((long)payload + 0x28) = piVar10;
    if (!bVar21) {
      *(byte *)((long)payload + 0x62) = *(byte *)((long)payload + 0x62) | 8;
    }
    if (uVar5 == 2) {
      piVar10[4] = 3;
    }
    else if (uVar5 == 1) {
      piVar10[4] = 1;
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGComputeInterleaves(void *payload, void *data,
                             const xmlChar * name ATTRIBUTE_UNUSED)
{
    xmlRelaxNGDefinePtr def = (xmlRelaxNGDefinePtr) payload;
    xmlRelaxNGParserCtxtPtr ctxt = (xmlRelaxNGParserCtxtPtr) data;
    xmlRelaxNGDefinePtr cur, *tmp;

    xmlRelaxNGPartitionPtr partitions = NULL;
    xmlRelaxNGInterleaveGroupPtr *groups = NULL;
    xmlRelaxNGInterleaveGroupPtr group;
    int i, j, ret, res;
    int nbgroups = 0;
    int nbchild = 0;
    int is_mixed = 0;
    int is_determinist = 1;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return;

    cur = def->content;
    while (cur != NULL) {
        nbchild++;
        cur = cur->next;
    }

    groups = (xmlRelaxNGInterleaveGroupPtr *)
        xmlMalloc(nbchild * sizeof(xmlRelaxNGInterleaveGroupPtr));
    if (groups == NULL)
        goto error;
    cur = def->content;
    while (cur != NULL) {
        groups[nbgroups] = (xmlRelaxNGInterleaveGroupPtr)
            xmlMalloc(sizeof(xmlRelaxNGInterleaveGroup));
        if (groups[nbgroups] == NULL)
            goto error;
        if (cur->type == XML_RELAXNG_TEXT)
            is_mixed++;
        groups[nbgroups]->rule = cur;
        groups[nbgroups]->defs = xmlRelaxNGGetElements(ctxt, cur, 2);
        groups[nbgroups]->attrs = xmlRelaxNGGetElements(ctxt, cur, 1);
        nbgroups++;
        cur = cur->next;
    }

    /*
     * Let's check that all rules makes a partitions according to 7.4
     */
    partitions = (xmlRelaxNGPartitionPtr)
        xmlMalloc(sizeof(xmlRelaxNGPartition));
    if (partitions == NULL)
        goto error;
    memset(partitions, 0, sizeof(xmlRelaxNGPartition));
    partitions->nbgroups = nbgroups;
    partitions->triage = xmlHashCreate(nbgroups);
    for (i = 0; i < nbgroups; i++) {
        group = groups[i];
        for (j = i + 1; j < nbgroups; j++) {
            if (groups[j] == NULL)
                continue;

            ret = xmlRelaxNGCompareElemDefLists(ctxt, group->defs,
                                                groups[j]->defs);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_ELEM_TEXT_CONFLICT,
                           "Element or text conflicts in interleave\n",
                           NULL, NULL);
            }
            ret = xmlRelaxNGCompareElemDefLists(ctxt, group->attrs,
                                                groups[j]->attrs);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_ATTR_CONFLICT,
                           "Attributes conflicts in interleave\n", NULL,
                           NULL);
            }
        }
        tmp = group->defs;
        if ((tmp != NULL) && (*tmp != NULL)) {
            while (*tmp != NULL) {
                if ((*tmp)->type == XML_RELAXNG_TEXT) {
                    res = xmlHashAddEntry2(partitions->triage,
                                           BAD_CAST "#text", NULL,
                                           XML_INT_TO_PTR(i + 1));
                    if (res != 0)
                        is_determinist = -1;
                } else if (((*tmp)->type == XML_RELAXNG_ELEMENT) &&
                           ((*tmp)->name != NULL)) {
                    if (((*tmp)->ns == NULL) || ((*tmp)->ns[0] == 0))
                        res = xmlHashAddEntry2(partitions->triage,
                                               (*tmp)->name, NULL,
                                               XML_INT_TO_PTR(i + 1));
                    else
                        res = xmlHashAddEntry2(partitions->triage,
                                               (*tmp)->name, (*tmp)->ns,
                                               XML_INT_TO_PTR(i + 1));
                    if (res != 0)
                        is_determinist = -1;
                } else if ((*tmp)->type == XML_RELAXNG_ELEMENT) {
                    if (((*tmp)->ns == NULL) || ((*tmp)->ns[0] == 0))
                        res = xmlHashAddEntry2(partitions->triage,
                                               BAD_CAST "#any", NULL,
                                               XML_INT_TO_PTR(i + 1));
                    else
                        res = xmlHashAddEntry2(partitions->triage,
                                               BAD_CAST "#any", (*tmp)->ns,
                                               XML_INT_TO_PTR(i + 1));
                    if ((*tmp)->nameClass != NULL)
                        is_determinist = 2;
                    if (res != 0)
                        is_determinist = -1;
                } else {
                    is_determinist = -1;
                }
                tmp++;
            }
        } else {
            is_determinist = 0;
        }
    }
    partitions->groups = groups;

    /*
     * and save the partition list back in the def
     */
    def->data = partitions;
    if (is_mixed != 0)
        def->dflags |= IS_MIXED;
    if (is_determinist == 1)
        partitions->flags = IS_DETERMINIST;
    if (is_determinist == 2)
        partitions->flags = IS_DETERMINIST | IS_NEEDCHECK;
    return;

  error:
    xmlRngPErrMemory(ctxt);
    if (groups != NULL) {
        for (i = 0; i < nbgroups; i++)
            if (groups[i] != NULL) {
                if (groups[i]->defs != NULL)
                    xmlFree(groups[i]->defs);
                xmlFree(groups[i]);
            }
        xmlFree(groups);
    }
    xmlRelaxNGFreePartition(partitions);
}